

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  ThreadSafeArena *this_00;
  LogMessage *pLVar1;
  ThreadSafeArenaStats *pTVar2;
  SerialArena *this_01;
  undefined1 auVar3 [16];
  ArenaBlock *b;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  string *local_28;
  string *absl_log_internal_check_op_result;
  ThreadSafeArena *parent_local;
  SizedPtr mem_local;
  
  absl_log_internal_check_op_result = (string *)mem.n;
  mem_local.p = mem.p;
  parent_local = (ThreadSafeArena *)this;
  local_30 = absl::lts_20240722::log_internal::GetReferenceableValue(0x88);
  local_38 = absl::lts_20240722::log_internal::GetReferenceableValue((unsigned_long)mem_local.p);
  local_28 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,
                        "kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize <= mem.n");
  if (local_28 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arena.cc"
               ,0xf9,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  pTVar2 = ThreadSafeArenaStatsHandle::MutableStats
                     ((ThreadSafeArenaStatsHandle *)
                      (absl_log_internal_check_op_result->field_2)._M_local_buf);
  ThreadSafeArenaStats::RecordAllocateStats(pTVar2,0,(size_t)mem_local.p,0);
  this_00 = parent_local;
  ArenaBlock::ArenaBlock((ArenaBlock *)parent_local,(ArenaBlock *)0x0,(size_t)mem_local.p);
  this_01 = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this_00,0x10);
  SerialArena(this_01,(ArenaBlock *)this_00,(ThreadSafeArena *)absl_log_internal_check_op_result);
  return this_01;
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}